

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O3

void __thiscall
JSON::JSONScanner::BuildUnescapedString(JSONScanner *this,bool shouldSkipLastCharacter)

{
  char16 cVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RangeCharacterPairList *pRVar8;
  char16 *pcVar9;
  Type *pTVar10;
  int iVar11;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  size_t sVar12;
  int index;
  uint local_34;
  
  if (this->allocator == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x199,"(this->allocator != nullptr)","We must have built the allocator");
    if (!bVar5) goto LAB_00b63abd;
    *puVar7 = 0;
  }
  pRVar8 = this->currentRangeCharacterPairList;
  if (pRVar8 == (RangeCharacterPairList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x19a,"(this->currentRangeCharacterPairList != nullptr)",
                       "We must have built the currentRangeCharacterPairList");
    if (!bVar5) goto LAB_00b63abd;
    *puVar7 = 0;
    pRVar8 = this->currentRangeCharacterPairList;
  }
  if ((pRVar8->
      super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
      ).count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x19b,"(this->currentRangeCharacterPairList->Count() > 0)",
                       "We need to build the current string only because we have escaped characters"
                      );
    if (!bVar5) goto LAB_00b63abd;
    *puVar7 = 0;
  }
  uVar2 = this->currentIndex;
  if (this->stringBufferLength < (int)uVar2) {
    this_00 = &this->allocator->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    if (this->stringBuffer != (char16_t *)0x0) {
      Memory::DeleteArray<Memory::ArenaAllocator,char16_t>
                ((AllocatorType *)this_00,(long)this->stringBufferLength,this->stringBuffer);
      this->stringBuffer = (char16 *)0x0;
      this_00 = &this->allocator->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    }
    if (uVar2 == 0) {
      pcVar9 = (char16 *)&DAT_00000008;
    }
    else {
      sVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        sVar12 = (long)(int)uVar2 * 2;
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00b63abd;
        *puVar7 = 0;
      }
      pcVar9 = (char16 *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(this_00,sVar12);
      if (pcVar9 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) goto LAB_00b63abd;
        *puVar7 = 0;
        pcVar9 = (char16 *)0x0;
      }
    }
    this->stringBuffer = pcVar9;
    this->stringBufferLength = uVar2;
  }
  iVar11 = (this->currentRangeCharacterPairList->
           super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
           ).count + -1;
  if (iVar11 < 0) {
    local_34 = 0;
  }
  else {
    pcVar9 = this->stringBuffer;
    local_34 = 0;
    index = 0;
    do {
      pTVar10 = JsUtil::
                List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->currentRangeCharacterPairList,index);
      uVar3 = pTVar10->m_rangeLength;
      sVar12 = (size_t)(int)uVar3;
      cVar1 = pTVar10->m_char;
      js_wmemcpy_s(pcVar9,sVar12,this->inputText + pTVar10->m_rangeStart,sVar12);
      pcVar9 = pcVar9 + sVar12;
      local_34 = local_34 + uVar3;
      if (!shouldSkipLastCharacter || iVar11 != index) {
        *pcVar9 = cVar1;
        pcVar9 = pcVar9 + 1;
        local_34 = local_34 + 1;
      }
      index = index + 1;
    } while (index <= iVar11);
  }
  if (local_34 != uVar2) {
    Output::TraceWithFlush
              (JSONPhase,L"BuildUnescapedString(): allocated size = %d != copying size %d\n");
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x1c4,"(totalCopied == requiredSize)",
                       "BuildUnescapedString(): The allocated size and copying size should match.");
    if (!bVar5) {
LAB_00b63abd:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  Output::TraceWithFlush
            (JSONPhase,L"BuildUnescapedString(): unescaped string as \'%.*s\'\n",
             (ulong)this->currentIndex,this->stringBuffer);
  return;
}

Assistant:

void JSONScanner::BuildUnescapedString(bool shouldSkipLastCharacter)
    {
        AssertMsg(this->allocator != nullptr, "We must have built the allocator");
        AssertMsg(this->currentRangeCharacterPairList != nullptr, "We must have built the currentRangeCharacterPairList");
        AssertMsg(this->currentRangeCharacterPairList->Count() > 0, "We need to build the current string only because we have escaped characters");

        // Step 1: Ensure the buffer has sufficient space
        int requiredSize = this->GetCurrentStringLen();
        if (requiredSize > this->stringBufferLength)
        {
            if (this->stringBuffer)
            {
                AdeleteArray(this->allocator, this->stringBufferLength, this->stringBuffer);
                this->stringBuffer = nullptr;
            }

            this->stringBuffer = AnewArray(this->allocator, char16, requiredSize);
            this->stringBufferLength = requiredSize;
        }

        // Step 2: Copy the data to the buffer
        int totalCopied = 0;
        char16* begin_copy = this->stringBuffer;
        int lastCharacterIndex = this->currentRangeCharacterPairList->Count() - 1;
        for (int i = 0; i <= lastCharacterIndex; i++)
        {
            RangeCharacterPair data = this->currentRangeCharacterPairList->Item(i);
            int charactersToCopy = data.m_rangeLength;
            js_wmemcpy_s(begin_copy, charactersToCopy, this->inputText + data.m_rangeStart, charactersToCopy);
            begin_copy += charactersToCopy;
            totalCopied += charactersToCopy;

            if (i == lastCharacterIndex && shouldSkipLastCharacter)
            {
                continue;
            }

            *begin_copy = data.m_char;
            begin_copy++;
            totalCopied++;
        }

        if (totalCopied != requiredSize)
        {
            OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("BuildUnescapedString(): allocated size = %d != copying size %d\n"), requiredSize, totalCopied);
            AssertMsg(totalCopied == requiredSize, "BuildUnescapedString(): The allocated size and copying size should match.");
        }

        OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("BuildUnescapedString(): unescaped string as '%.*s'\n"), GetCurrentStringLen(), this->stringBuffer);
    }